

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_DestroyObject(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject)

{
  char cVar1;
  CK_BBOOL isTokenObject;
  CK_BBOOL isPrivateObject;
  Session *this_00;
  Token *pTVar2;
  long *plVar3;
  CK_STATE sessionState;
  CK_RV CVar4;
  int lineNo;
  char *format;
  
  CVar4 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar4 = 0xb3;
    }
    else {
      pTVar2 = Session::getToken(this_00);
      if (pTVar2 == (Token *)0x0) {
        CVar4 = 5;
      }
      else {
        plVar3 = (long *)HandleManager::getObject(this->handleManager,hObject);
        CVar4 = 0x82;
        if ((plVar3 != (long *)0x0) &&
           (cVar1 = (**(code **)(*plVar3 + 0x50))(plVar3), cVar1 != '\0')) {
          isTokenObject = (**(code **)(*plVar3 + 0x20))(plVar3,1,0);
          isPrivateObject = (**(code **)(*plVar3 + 0x20))(plVar3,2,1);
          sessionState = Session::getState(this_00);
          CVar4 = haveWrite(sessionState,isTokenObject,isPrivateObject);
          if (CVar4 == 0) {
            cVar1 = (**(code **)(*plVar3 + 0x20))(plVar3,0x172,1);
            CVar4 = 0x1b;
            if (cVar1 != '\0') {
              HandleManager::destroyObject(this->handleManager,hObject);
              cVar1 = (**(code **)(*plVar3 + 0x70))(plVar3);
              CVar4 = 6;
              if (cVar1 != '\0') {
                CVar4 = 0;
              }
            }
          }
          else {
            if (CVar4 == 0xb5) {
              format = "Session is read-only";
              lineNo = 0x702;
            }
            else {
              if (CVar4 != 0x101) {
                return CVar4;
              }
              format = "User is not authorized";
              lineNo = 0x700;
            }
            softHSMLog(6,"C_DestroyObject",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,lineNo,format);
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_DestroyObject(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	CK_RV rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Check if the object is destroyable
	CK_BBOOL isDestroyable = object->getBooleanValue(CKA_DESTROYABLE, true);
	if (!isDestroyable) return CKR_ACTION_PROHIBITED;

	// Tell the handleManager to forget about the object.
	handleManager->destroyObject(hObject);

	// Destroy the object
	if (!object->destroyObject())
		return CKR_FUNCTION_FAILED;

	return CKR_OK;
}